

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_compressionParameters *
ZSTD_getCParamsFromCCtxParams
          (ZSTD_compressionParameters *__return_storage_ptr__,ZSTD_CCtx_params *CCtxParams,
          U64 srcSizeHint,size_t dictSize,ZSTD_cParamMode_e mode)

{
  ZSTD_compressionParameters cPar;
  undefined1 local_5c [24];
  ZSTD_strategy local_44;
  undefined1 local_40 [8];
  ZSTD_compressionParameters cParams;
  ZSTD_cParamMode_e mode_local;
  size_t dictSize_local;
  U64 srcSizeHint_local;
  ZSTD_CCtx_params *CCtxParams_local;
  
  dictSize_local = srcSizeHint;
  if ((srcSizeHint == 0xffffffffffffffff) && (0 < CCtxParams->srcSizeHint)) {
    dictSize_local = (size_t)CCtxParams->srcSizeHint;
  }
  cParams.targetLength = mode;
  unique0x100000f9 = dictSize;
  ZSTD_getCParams_internal
            ((ZSTD_compressionParameters *)local_5c,CCtxParams->compressionLevel,dictSize_local,
             dictSize,mode);
  local_40 = (undefined1  [8])local_5c._0_8_;
  cParams.windowLog = local_5c._8_4_;
  cParams.chainLog = local_5c._12_4_;
  cParams.hashLog = local_5c._16_4_;
  cParams.searchLog = local_5c._20_4_;
  cParams.minMatch = local_44;
  if ((CCtxParams->ldmParams).enableLdm != 0) {
    local_40._4_4_ = SUB84(local_5c._0_8_,4);
    local_40._0_4_ = 0x1b;
  }
  ZSTD_overrideCParams((ZSTD_compressionParameters *)local_40,&CCtxParams->cParams);
  cPar.hashLog = cParams.windowLog;
  cPar.searchLog = cParams.chainLog;
  cPar.windowLog = local_40._0_4_;
  cPar.chainLog = local_40._4_4_;
  cPar.minMatch = cParams.hashLog;
  cPar.targetLength = cParams.searchLog;
  cPar.strategy = cParams.minMatch;
  ZSTD_adjustCParams_internal
            (__return_storage_ptr__,cPar,dictSize_local,stack0xffffffffffffffe0,cParams.targetLength
            );
  return __return_storage_ptr__;
}

Assistant:

ZSTD_compressionParameters ZSTD_getCParamsFromCCtxParams(
        const ZSTD_CCtx_params* CCtxParams, U64 srcSizeHint, size_t dictSize, ZSTD_cParamMode_e mode)
{
    ZSTD_compressionParameters cParams;
    if (srcSizeHint == ZSTD_CONTENTSIZE_UNKNOWN && CCtxParams->srcSizeHint > 0) {
      srcSizeHint = CCtxParams->srcSizeHint;
    }
    cParams = ZSTD_getCParams_internal(CCtxParams->compressionLevel, srcSizeHint, dictSize, mode);
    if (CCtxParams->ldmParams.enableLdm) cParams.windowLog = ZSTD_LDM_DEFAULT_WINDOW_LOG;
    ZSTD_overrideCParams(&cParams, &CCtxParams->cParams);
    assert(!ZSTD_checkCParams(cParams));
    /* srcSizeHint == 0 means 0 */
    return ZSTD_adjustCParams_internal(cParams, srcSizeHint, dictSize, mode);
}